

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_bin2hex(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte *pbVar1;
  byte *pbVar2;
  uchar *zIn;
  int nLen;
  char local_2f;
  char local_2e;
  int local_2c;
  
  if (nArg < 1) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    pbVar1 = (byte *)jx9_value_to_string(*apArg,&local_2c);
    if ((long)local_2c < 1) {
      jx9_value_string(pCtx->pRet,"",0);
    }
    else {
      pbVar2 = pbVar1 + local_2c;
      do {
        local_2f = "0123456789abcdef"[*pbVar1 >> 4];
        local_2e = "0123456789abcdef"[*pbVar1 & 0xf];
        jx9_value_string(pCtx->pRet,&local_2f,2);
        pbVar1 = pbVar1 + 1;
      } while (pbVar1 < pbVar2);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_bin2hex(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	SyBinToHexConsumer((const void *)zString, (sxu32)nLen, HashConsumer, pCtx);
	return JX9_OK;
}